

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall
ON_NurbsCurve::IsContinuous
          (ON_NurbsCurve *this,continuity desired_continuity,double t,int *hint,
          double point_tolerance,double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  double t_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  continuity desired_continuity_00;
  int iVar7;
  int iVar8;
  int knot_index;
  double dVar9;
  double t_01;
  int tmp_hint;
  
  iVar6 = this->m_order;
  if (iVar6 < 3) {
    desired_continuity = ON::PolylineContinuity(desired_continuity);
    iVar6 = this->m_order;
  }
  if ((t <= this->m_knot[(long)iVar6 + -2]) || (this->m_knot[(long)this->m_cv_count + -1] <= t)) {
    bVar4 = ON_Curve::IsContinuous
                      (&this->super_ON_Curve,desired_continuity,t,hint,point_tolerance,d1_tolerance,
                       d2_tolerance,cos_angle_tolerance,curvature_tolerance);
    return bVar4;
  }
  desired_continuity_00 = ON::ParametricContinuity(desired_continuity);
  if (desired_continuity_00 == C0_continuous || this->m_cv_count <= this->m_order) {
    return true;
  }
  if (hint == (int *)0x0) {
    hint = &tmp_hint;
    tmp_hint = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = *hint;
  }
  iVar7 = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,t,1,iVar6);
  iVar6 = this->m_order + iVar7;
  pdVar1 = this->m_knot + (long)iVar6 + -2;
  dVar2 = *pdVar1;
  t_00 = pdVar1[1];
  dVar9 = (ABS(t_00 - dVar2) + ABS(t_00) + ABS(dVar2)) * 1.490116119385e-08;
  t_01 = t;
  if (((dVar2 + dVar9 < t_00 - dVar9) &&
      (((iVar7 < 1 || (t_01 = dVar2, dVar9 < ABS(t - dVar2))) && (t_01 = t, ABS(t - t_00) <= dVar9))
      )) && (iVar6 < this->m_cv_count)) {
    iVar7 = ON_NurbsSpanIndex(this->m_order,this->m_cv_count,this->m_knot,t_00,1,*hint);
    t_01 = t_00;
  }
  iVar6 = 0;
  if (0 < iVar7) {
    iVar6 = iVar7;
  }
  *hint = iVar6;
  if (0 < iVar7) {
    iVar7 = this->m_order;
    knot_index = iVar6 + iVar7 + -2;
    if (knot_index < this->m_cv_count + -1) {
      dVar2 = this->m_knot[knot_index];
      if ((dVar2 == t_01) && (!NAN(dVar2) && !NAN(t_01))) {
        bVar4 = desired_continuity_00 != Cinfinity_continuous;
        if (desired_continuity_00 == Cinfinity_continuous) {
          return bVar4;
        }
        iVar8 = ON_KnotMultiplicity(iVar7,this->m_cv_count,this->m_knot,knot_index);
        switch(desired_continuity_00) {
        case C1_continuous:
        case G1_continuous:
          if (1 < this->m_order - iVar8) {
            return bVar4;
          }
          break;
        case C2_continuous:
        case G2_continuous:
        case Gsmooth_continuous:
          if (2 < this->m_order - iVar8) {
            return bVar4;
          }
        }
        bVar4 = ON_Curve::IsContinuous
                          (&this->super_ON_Curve,desired_continuity_00,t_01,hint,point_tolerance,
                           d1_tolerance,d2_tolerance,cos_angle_tolerance,curvature_tolerance);
        if (desired_continuity_00 != Gsmooth_continuous) {
          return bVar4;
        }
        if (!bVar4) {
          return bVar4;
        }
        iVar3 = this->m_order;
        if (iVar3 + -2 < knot_index && iVar8 == iVar3 + -1) {
          if (this->m_cv_count + -1 <= knot_index) {
            return true;
          }
          bVar4 = SpanIsLinear(this,(iVar6 + iVar7) - iVar3,1e-08,1e-08);
          bVar5 = SpanIsLinear(this,knot_index + this->m_order * -2 + 3,1e-08,1e-08);
          if (bVar4) {
            return bVar4 == bVar5;
          }
          if (bVar5) {
            return bVar4 == bVar5;
          }
          bVar4 = ON_NurbsArcToArcTransitionIsNotGsmooth
                            (this,knot_index,cos_angle_tolerance,curvature_tolerance);
          return !bVar4;
        }
      }
    }
  }
  return true;
}

Assistant:

bool ON_NurbsCurve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  bool rc = true;

  if ( m_order <= 2 )
    desired_continuity = ON::PolylineContinuity((int)desired_continuity);

  if ( t <= m_knot[m_order-2] || t >= m_knot[m_cv_count-1] )
  {
    // 20 March 2003 Dale Lear
    //     Consistently handles locus case and out of domain case.
    rc = ON_Curve::IsContinuous( 
               desired_continuity, t, hint, 
               point_tolerance, 
               d1_tolerance, d2_tolerance, 
               cos_angle_tolerance, 
               curvature_tolerance );
    return rc;
  }

  // "locus" and "parametric" are the same at this point.
  desired_continuity = ON::ParametricContinuity((int)desired_continuity);

  if ( m_order < m_cv_count && desired_continuity != ON::continuity::C0_continuous )
  {
    int tmp_hint;
    if ( !hint )
    {
      tmp_hint = 0;
      hint = &tmp_hint;
    }
    int ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t,1,*hint);

    {
      // 20 March 2003 Dale Lear:
      //     If t is very near interior m_t[] value, see if it
      //     should be set to that value.  A bit or two of 
      //     precision sometimes gets lost in proxy
      //     domain to real curve domain conversions on the interior
      //     of a curve domain.
      int ii = ki+m_order-2;
      double segtol = (fabs(m_knot[ii]) + fabs(m_knot[ii+1]) + fabs(m_knot[ii+1]-m_knot[ii]))*ON_SQRT_EPSILON;
      if ( m_knot[ii]+segtol < m_knot[ii+1]-segtol )
      {
        if ( fabs(t-m_knot[ii]) <= segtol && ii > m_order-2 )
        {
          t = m_knot[ii];
        }
        else if ( fabs(t-m_knot[ii+1]) <= segtol && ii+2 < m_cv_count )
        {
          t = m_knot[ii+1];
          ki = ON_NurbsSpanIndex(m_order,m_cv_count,m_knot,t,1,*hint);
        }
      }
    }

    if ( ki < 0 )
      ki = 0;
    *hint = ki;
    ki += m_order-2;
    if ( ki > m_order-2 && ki < m_cv_count-1 && m_knot[ki] == t  )
    {
      if ( ON::continuity::Cinfinity_continuous == desired_continuity )
      {
        // Cinfinity_continuous is a euphemism for "at a knot"
        return false;
      }

      // t = interior knot value - check for discontinuity
      int knot_mult = ON_KnotMultiplicity( m_order, m_cv_count, m_knot, ki );

      switch(desired_continuity)
      {
      case ON::continuity::C2_continuous: 
        if ( m_order - knot_mult >= 3 )
          return true;
        break;
      case ON::continuity::C1_continuous: 
        if ( m_order - knot_mult >= 2 )
          return true;
        break;
      case ON::continuity::G2_continuous: 
      case ON::continuity::Gsmooth_continuous: 
        if ( m_order - knot_mult >= 3 )
          return true;
        break;
      case ON::continuity::G1_continuous: 
        if ( m_order - knot_mult >= 2 )
          return true;
        break;
      default:
        // intentionally ignoring other ON::continuity enum values
        break;
      }
 
      // need to evaluate at knot
      rc = ON_Curve::IsContinuous( desired_continuity, t, hint, 
                           point_tolerance, d1_tolerance, d2_tolerance, 
                           cos_angle_tolerance, curvature_tolerance );

      if ( rc 
           && ON::continuity::Gsmooth_continuous == desired_continuity 
           && knot_mult == m_order-1 
           && ki > m_order-2
           && ki < m_cv_count-1
           )
      {
        // See if we are transitioning from linear to non-linear
        const double is_linear_tolerance = 1.0e-8;  
        const double is_linear_min_length = 1.0e-8;
        bool bIsLinear0 = SpanIsLinear(ki - m_order + 2,is_linear_min_length,is_linear_tolerance);
        bool bIsLinear1 = SpanIsLinear(ki - 2*m_order + 3,is_linear_min_length,is_linear_tolerance);
        if ( bIsLinear0 != bIsLinear1 )
        {
          rc = false;
        }
        else if ( !bIsLinear0 && ON_NurbsArcToArcTransitionIsNotGsmooth(*this,ki,cos_angle_tolerance,curvature_tolerance) )
        {
          // aesthetic arc - arc discontinuity
          rc = false;
        }
      }
    }
  }
  return rc;
}